

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_predict_hbd_8x16_ssse3
               (int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd)

{
  short sVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  ushort uVar8;
  short sVar10;
  ushort uVar11;
  short sVar12;
  ushort uVar13;
  short sVar14;
  ushort uVar15;
  short sVar16;
  ushort uVar17;
  short sVar18;
  ushort uVar19;
  short sVar20;
  ushort uVar21;
  undefined1 auVar9 [16];
  short sVar22;
  ushort uVar23;
  undefined1 auVar24 [16];
  
  auVar3 = pshuflw(ZEXT416((uint)alpha_q3),ZEXT416((uint)alpha_q3),0);
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar4 = pabsw(in_XMM1,auVar3);
  auVar4 = psllw(auVar4,9);
  auVar5 = pshuflw(ZEXT216(*dst),ZEXT216(*dst),0);
  auVar9._8_4_ = 0xffffffff;
  auVar9._0_8_ = 0xffffffffffffffff;
  auVar9._12_4_ = 0xffffffff;
  auVar6._8_4_ = 0xffffffff;
  auVar6._0_8_ = 0xffffffffffffffff;
  auVar6._12_4_ = 0xffffffff;
  auVar6 = psllw(auVar6,ZEXT416((uint)bd));
  auVar6 = auVar6 ^ auVar9;
  uVar2 = 0xffffffffffffffc0;
  do {
    auVar9 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x40);
    auVar24 = psignw(auVar3,auVar9);
    auVar9 = pabsw(auVar9,auVar9);
    auVar9 = pmulhrsw(auVar9,auVar4);
    auVar9 = psignw(auVar9,auVar24);
    sVar20 = auVar5._0_2_;
    sVar7 = auVar9._0_2_ + sVar20;
    sVar22 = auVar5._2_2_;
    sVar10 = auVar9._2_2_ + sVar22;
    sVar12 = auVar9._4_2_ + sVar20;
    sVar14 = auVar9._6_2_ + sVar22;
    sVar16 = auVar9._8_2_ + sVar20;
    sVar18 = auVar9._10_2_ + sVar22;
    sVar20 = auVar9._12_2_ + sVar20;
    sVar22 = auVar9._14_2_ + sVar22;
    sVar1 = auVar6._0_2_;
    uVar8 = (ushort)(sVar1 < sVar7) * sVar1 | (ushort)(sVar1 >= sVar7) * sVar7;
    sVar1 = auVar6._2_2_;
    uVar11 = (ushort)(sVar1 < sVar10) * sVar1 | (ushort)(sVar1 >= sVar10) * sVar10;
    sVar1 = auVar6._4_2_;
    uVar13 = (ushort)(sVar1 < sVar12) * sVar1 | (ushort)(sVar1 >= sVar12) * sVar12;
    sVar1 = auVar6._6_2_;
    uVar15 = (ushort)(sVar1 < sVar14) * sVar1 | (ushort)(sVar1 >= sVar14) * sVar14;
    sVar1 = auVar6._8_2_;
    uVar17 = (ushort)(sVar1 < sVar16) * sVar1 | (ushort)(sVar1 >= sVar16) * sVar16;
    sVar1 = auVar6._10_2_;
    uVar19 = (ushort)(sVar1 < sVar18) * sVar1 | (ushort)(sVar1 >= sVar18) * sVar18;
    sVar1 = auVar6._12_2_;
    uVar21 = (ushort)(sVar1 < sVar20) * sVar1 | (ushort)(sVar1 >= sVar20) * sVar20;
    sVar1 = auVar6._14_2_;
    uVar23 = (ushort)(sVar1 < sVar22) * sVar1 | (ushort)(sVar1 >= sVar22) * sVar22;
    *dst = (-1 < (short)uVar8) * uVar8;
    dst[1] = (-1 < (short)uVar11) * uVar11;
    dst[2] = (-1 < (short)uVar13) * uVar13;
    dst[3] = (-1 < (short)uVar15) * uVar15;
    dst[4] = (-1 < (short)uVar17) * uVar17;
    dst[5] = (-1 < (short)uVar19) * uVar19;
    dst[6] = (-1 < (short)uVar21) * uVar21;
    dst[7] = (-1 < (short)uVar23) * uVar23;
    uVar2 = uVar2 + 0x40;
    dst = dst + dst_stride;
  } while (uVar2 < 0x3c0);
  return;
}

Assistant:

static inline void cfl_predict_hbd_ssse3(const int16_t *pred_buf_q3,
                                         uint16_t *dst, int dst_stride,
                                         int alpha_q3, int bd, int width,
                                         int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  const __m128i max = highbd_max_epi16(bd);
  const __m128i zeros = _mm_setzero_si128();
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    res = highbd_clamp_epi16(res, zeros, max);
    if (width == 4) {
      _mm_storel_epi64((__m128i *)dst, res);
    } else {
      _mm_storeu_si128((__m128i *)dst, res);
    }
    if (width >= 16) {
      const __m128i res_1 =
          predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128(((__m128i *)dst) + 1,
                       highbd_clamp_epi16(res_1, zeros, max));
    }
    if (width == 32) {
      const __m128i res_2 =
          predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 16),
                       highbd_clamp_epi16(res_2, zeros, max));
      const __m128i res_3 =
          predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 24),
                       highbd_clamp_epi16(res_3, zeros, max));
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}